

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O2

void __thiscall
dg::pta::PointerAnalysisFSInv::PointerAnalysisFSInv
          (PointerAnalysisFSInv *this,PointerGraph *ps,PointerAnalysisOptions *opts)

{
  PointerAnalysisOptions local_60;
  
  opts->invalidateNodes = true;
  PointerAnalysisOptions::PointerAnalysisOptions(&local_60,opts);
  PointerAnalysisFS::PointerAnalysisFS(&this->super_PointerAnalysisFS,ps,&local_60);
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::~_Rb_tree(&local_60.super_AnalysisOptions.allocationFunctions._M_t);
  (this->super_PointerAnalysisFS).super_PointerAnalysis._vptr_PointerAnalysis =
       (_func_int **)&PTR__PointerAnalysisFS_00122c18;
  return;
}

Assistant:

PointerAnalysisFSInv(PointerGraph *ps, PointerAnalysisOptions opts)
            : PointerAnalysisFS(ps, opts.setInvalidateNodes(true)) {}